

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_pcg_serial.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint onoff;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  SUNMatrix A;
  SUNLinearSolver S;
  N_Vector x_00;
  N_Vector z_vec;
  N_Vector v_vec;
  N_Vector s2;
  undefined8 uVar12;
  void *pvVar13;
  long in_RSI;
  int in_EDI;
  char *funcname;
  sunrealtype sVar14;
  SUNContext sunctx;
  double tol;
  sunrealtype *vecdata;
  sunindextype i;
  int print_timing;
  int maxl;
  UserData ProbData;
  N_Vector b;
  N_Vector x;
  N_Vector xhat;
  SUNLinearSolver LS;
  int passfail;
  int fails;
  undefined4 local_78;
  int in_stack_ffffffffffffff8c;
  void *in_stack_ffffffffffffff98;
  N_Vector s1;
  SUNLinearSolver p_Var15;
  void *Pdata;
  uint local_18;
  uint local_4;
  
  iVar1 = SUNContext_Create(0,&local_78);
  if (iVar1 == 0) {
    if (in_EDI < 5) {
      printf("ERROR: FOUR (4) Inputs required:\n");
      printf("  Problem size should be >0\n");
      printf("  Maximum Krylov subspace dimension should be >0\n");
      printf("  Solver tolerance should be >0\n");
      printf("  timing output flag should be 0 or 1 \n");
      local_4 = 1;
    }
    else {
      problem_size = atol(*(char **)(in_RSI + 8));
      if (problem_size < 1) {
        printf("ERROR: Problem size must be a positive integer\n");
        local_4 = 1;
      }
      else {
        Pdata = (void *)problem_size;
        uVar2 = atoi(*(char **)(in_RSI + 0x10));
        if ((int)uVar2 < 1) {
          printf("ERROR: Maximum Krylov subspace dimension must be a positive integer\n");
          local_4 = 1;
        }
        else {
          funcname = (char *)atof(*(char **)(in_RSI + 0x18));
          if (0.0 < (double)funcname) {
            onoff = atoi(*(char **)(in_RSI + 0x20));
            SetTiming(onoff);
            printf("\nPCG linear solver test:\n");
            printf("  Problem size = %ld\n",Pdata);
            printf("  Maximum Krylov subspace dimension = %i\n",(ulong)uVar2);
            printf("  Solver Tolerance = %g\n",funcname);
            printf("  timing output flag = %i\n\n",(ulong)onoff);
            A = (SUNMatrix)N_VNew_Serial(Pdata,CONCAT44(in_stack_ffffffffffffff8c,local_78));
            iVar1 = check_flag(in_stack_ffffffffffffff98,funcname,in_stack_ffffffffffffff8c);
            if (iVar1 == 0) {
              S = (SUNLinearSolver)N_VNew_Serial(Pdata,CONCAT44(in_stack_ffffffffffffff8c,local_78))
              ;
              iVar1 = check_flag(in_stack_ffffffffffffff98,funcname,in_stack_ffffffffffffff8c);
              if (iVar1 == 0) {
                x_00 = (N_Vector)N_VNew_Serial(Pdata,CONCAT44(in_stack_ffffffffffffff8c,local_78));
                iVar1 = check_flag(in_stack_ffffffffffffff98,funcname,in_stack_ffffffffffffff8c);
                if (iVar1 == 0) {
                  z_vec = (N_Vector)
                          N_VNew_Serial(Pdata,CONCAT44(in_stack_ffffffffffffff8c,local_78));
                  iVar1 = check_flag(in_stack_ffffffffffffff98,funcname,in_stack_ffffffffffffff8c);
                  if (iVar1 == 0) {
                    v_vec = (N_Vector)
                            N_VNew_Serial(Pdata,CONCAT44(in_stack_ffffffffffffff8c,local_78));
                    iVar1 = check_flag(in_stack_ffffffffffffff98,funcname,in_stack_ffffffffffffff8c)
                    ;
                    if (iVar1 == 0) {
                      s2 = (N_Vector)N_VGetArrayPointer(S);
                      for (s1 = (N_Vector)0x0; (long)s1 < (long)Pdata;
                          s1 = (N_Vector)((long)&s1->content + 1)) {
                        sVar14 = urand();
                        (&s2->content)[(long)s1] = (void *)(sVar14 + 1.0);
                      }
                      N_VConst(0x4014000000000000,z_vec);
                      uVar12 = SUNLinSol_PCG(A,2,uVar2,CONCAT44(in_stack_ffffffffffffff8c,local_78))
                      ;
                      iVar1 = Test_SUNLinSolGetType
                                        ((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                         (SUNLinearSolver_Type)((ulong)s1 >> 0x20),(int)s1);
                      iVar3 = Test_SUNLinSolGetID((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                  (SUNLinearSolver_ID)((ulong)s1 >> 0x20),(int)s1);
                      iVar4 = Test_SUNLinSolSetATimes
                                        ((SUNLinearSolver)CONCAT44(uVar2,onoff),s1,(SUNATimesFn)s2,
                                         (int)((ulong)funcname >> 0x20));
                      iVar5 = Test_SUNLinSolSetPreconditioner
                                        ((SUNLinearSolver)z_vec,Pdata,
                                         (SUNPSetupFn)CONCAT44(uVar2,onoff),(SUNPSolveFn)s1,
                                         (int)((ulong)s2 >> 0x20));
                      iVar6 = Test_SUNLinSolSetScalingVectors
                                        ((SUNLinearSolver)CONCAT44(uVar2,onoff),s1,s2,
                                         (int)((ulong)funcname >> 0x20));
                      iVar7 = Test_SUNLinSolSetZeroGuess
                                        ((SUNLinearSolver)s2,(int)((ulong)funcname >> 0x20));
                      iVar8 = Test_SUNLinSolInitialize
                                        ((SUNLinearSolver)s2,(int)((ulong)funcname >> 0x20));
                      iVar9 = Test_SUNLinSolSpace((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                  (int)((ulong)s1 >> 0x20));
                      uVar10 = iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar1;
                      if (uVar10 == 0) {
                        printf("SUCCESS: SUNLinSol_PCG module passed all initialization tests\n\n");
                        N_VConst(0x3ff0000000000000,v_vec);
                        N_VProd(S,v_vec,A);
                        iVar1 = ATimes(x_00,v_vec,z_vec);
                        iVar3 = check_flag(s2,funcname,in_stack_ffffffffffffff8c);
                        if (iVar3 == 0) {
                          iVar3 = SUNLinSol_PCGSetPrecType(uVar12,0);
                          iVar4 = Test_SUNLinSolSetup((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                      (SUNMatrix)s1,(int)((ulong)s2 >> 0x20));
                          iVar5 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                      (int)((ulong)Pdata >> 0x20),(int)Pdata);
                          iVar6 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                      (int)((ulong)Pdata >> 0x20),(int)Pdata);
                          iVar7 = Test_SUNLinSolLastFlag
                                            ((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                             (int)((ulong)s1 >> 0x20));
                          iVar8 = Test_SUNLinSolNumIters
                                            ((SUNLinearSolver)s1,(int)((ulong)s2 >> 0x20));
                          iVar9 = Test_SUNLinSolResNorm
                                            ((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                             (int)((ulong)s1 >> 0x20));
                          iVar11 = Test_SUNLinSolResid((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                       (int)((ulong)s1 >> 0x20));
                          uVar10 = iVar11 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar1;
                          if (uVar10 == 0) {
                            printf("SUCCESS: SUNLinSol_PCG module, problem 1, passed all tests\n\n")
                            ;
                          }
                          else {
                            printf("FAIL: SUNLinSol_PCG module, problem 1, failed %i tests\n\n",
                                   (ulong)uVar10);
                          }
                          local_18 = (uint)(uVar10 != 0);
                          N_VConst(0x3ff0000000000000,v_vec);
                          N_VProd(S,v_vec,A);
                          iVar1 = ATimes(x_00,v_vec,z_vec);
                          iVar3 = check_flag(s2,funcname,in_stack_ffffffffffffff8c);
                          iVar4 = (int)((ulong)s2 >> 0x20);
                          if (iVar3 == 0) {
                            iVar3 = SUNLinSol_PCGSetPrecType(uVar12,2);
                            iVar5 = Test_SUNLinSolSetup((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                        (SUNMatrix)s1,iVar4);
                            iVar6 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                        (int)((ulong)Pdata >> 0x20),(int)Pdata);
                            iVar7 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                        (int)((ulong)Pdata >> 0x20),(int)Pdata);
                            iVar8 = Test_SUNLinSolLastFlag
                                              ((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                               (int)((ulong)s1 >> 0x20));
                            iVar4 = Test_SUNLinSolNumIters((SUNLinearSolver)s1,iVar4);
                            iVar11 = (int)((ulong)s1 >> 0x20);
                            iVar9 = Test_SUNLinSolResNorm
                                              ((SUNLinearSolver)CONCAT44(uVar2,onoff),iVar11);
                            iVar11 = Test_SUNLinSolResid((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                         iVar11);
                            uVar10 = iVar11 + iVar9 + iVar4 + iVar8 + iVar7 + iVar6 + iVar5 + iVar3 
                                                  + iVar1;
                            if (uVar10 == 0) {
                              printf(
                                    "SUCCESS: SUNLinSol_PCG module, problem 2, passed all tests\n\n"
                                    );
                            }
                            else {
                              printf("FAIL: SUNLinSol_PCG module, problem 2, failed %i tests\n\n",
                                     (ulong)uVar10);
                              local_18 = local_18 + 1;
                            }
                            pvVar13 = (void *)N_VGetArrayPointer(v_vec);
                            for (p_Var15 = (SUNLinearSolver)0x0; (long)p_Var15 < (long)Pdata;
                                p_Var15 = (SUNLinearSolver)((long)&p_Var15->content + 1)) {
                              sVar14 = urand();
                              *(double *)((long)pvVar13 + (long)p_Var15 * 8) = sVar14 * 1000.0 + 1.0
                              ;
                            }
                            N_VProd(S,v_vec,A);
                            iVar1 = ATimes(x_00,v_vec,z_vec);
                            iVar3 = check_flag(pvVar13,funcname,in_stack_ffffffffffffff8c);
                            iVar4 = (int)((ulong)pvVar13 >> 0x20);
                            if (iVar3 == 0) {
                              iVar3 = SUNLinSol_PCGSetPrecType(uVar12,0);
                              iVar5 = Test_SUNLinSolSetup((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                          (SUNMatrix)p_Var15,iVar4);
                              iVar6 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                          (int)((ulong)Pdata >> 0x20),(int)Pdata);
                              iVar7 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                          (int)((ulong)Pdata >> 0x20),(int)Pdata);
                              iVar8 = Test_SUNLinSolLastFlag
                                                ((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                 (int)((ulong)p_Var15 >> 0x20));
                              iVar4 = Test_SUNLinSolNumIters(p_Var15,iVar4);
                              iVar11 = (int)((ulong)p_Var15 >> 0x20);
                              iVar9 = Test_SUNLinSolResNorm
                                                ((SUNLinearSolver)CONCAT44(uVar2,onoff),iVar11);
                              iVar11 = Test_SUNLinSolResid((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                           iVar11);
                              uVar10 = iVar11 + iVar9 + iVar4 + iVar8 + iVar7 + iVar6 + iVar5 + 
                                                  iVar3 + iVar1;
                              if (uVar10 == 0) {
                                printf(
                                      "SUCCESS: SUNLinSol_PCG module, problem 3, passed all tests\n\n"
                                      );
                              }
                              else {
                                printf("FAIL: SUNLinSol_PCG module, problem 3, failed %i tests\n\n",
                                       (ulong)uVar10);
                                local_18 = local_18 + 1;
                              }
                              pvVar13 = (void *)N_VGetArrayPointer(v_vec);
                              for (p_Var15 = (SUNLinearSolver)0x0; (long)p_Var15 < (long)Pdata;
                                  p_Var15 = (SUNLinearSolver)((long)&p_Var15->content + 1)) {
                                sVar14 = urand();
                                *(double *)((long)pvVar13 + (long)p_Var15 * 8) =
                                     sVar14 * 1000.0 + 1.0;
                              }
                              N_VProd(S,v_vec,A);
                              iVar1 = ATimes(x_00,v_vec,z_vec);
                              iVar3 = check_flag(pvVar13,funcname,in_stack_ffffffffffffff8c);
                              iVar4 = (int)((ulong)pvVar13 >> 0x20);
                              if (iVar3 == 0) {
                                iVar3 = SUNLinSol_PCGSetPrecType(uVar12,2);
                                iVar5 = Test_SUNLinSolSetup((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                            (SUNMatrix)p_Var15,iVar4);
                                iVar6 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                            (int)((ulong)Pdata >> 0x20),(int)Pdata);
                                iVar7 = Test_SUNLinSolSolve(S,A,x_00,v_vec,(sunrealtype)z_vec,
                                                            (int)((ulong)Pdata >> 0x20),(int)Pdata);
                                iVar8 = Test_SUNLinSolLastFlag
                                                  ((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                   (int)((ulong)p_Var15 >> 0x20));
                                iVar4 = Test_SUNLinSolNumIters(p_Var15,iVar4);
                                iVar11 = (int)((ulong)p_Var15 >> 0x20);
                                iVar9 = Test_SUNLinSolResNorm
                                                  ((SUNLinearSolver)CONCAT44(uVar2,onoff),iVar11);
                                iVar11 = Test_SUNLinSolResid((SUNLinearSolver)CONCAT44(uVar2,onoff),
                                                             iVar11);
                                uVar2 = iVar11 + iVar9 + iVar4 + iVar8 + iVar7 + iVar6 + iVar5 + 
                                                  iVar3 + iVar1;
                                if (uVar2 == 0) {
                                  printf(
                                        "SUCCESS: SUNLinSol_PCG module, problem 4, passed all tests\n\n"
                                        );
                                }
                                else {
                                  printf("FAIL: SUNLinSol_PCG module, problem 4, failed %i tests\n\n"
                                         ,(ulong)uVar2);
                                  local_18 = local_18 + 1;
                                }
                                SUNLinSolFree(uVar12);
                                N_VDestroy(A);
                                N_VDestroy(S);
                                N_VDestroy(x_00);
                                N_VDestroy(z_vec);
                                N_VDestroy(v_vec);
                                SUNContext_Free(&local_78);
                                local_4 = local_18;
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        printf("FAIL: SUNLinSol_PCG module failed %i initialization tests\n\n",
                               (ulong)uVar10);
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            printf("ERROR: Solver tolerance must be a positive real number\n");
            local_4 = 1;
          }
        }
      }
    }
  }
  else {
    printf("ERROR: SUNContext_Create failed\n");
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails    = 0;    /* counter for test failures */
  int passfail = 0;    /* overall pass/fail flag    */
  SUNLinearSolver LS;  /* linear solver object      */
  N_Vector xhat, x, b; /* test vectors              */
  UserData ProbData;   /* problem data structure    */
  int maxl, print_timing;
  sunindextype i;
  sunrealtype* vecdata;
  double tol;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check inputs: local problem size, timing flag */
  if (argc < 5)
  {
    printf("ERROR: FOUR (4) Inputs required:\n");
    printf("  Problem size should be >0\n");
    printf("  Maximum Krylov subspace dimension should be >0\n");
    printf("  Solver tolerance should be >0\n");
    printf("  timing output flag should be 0 or 1 \n");
    return 1;
  }
  ProbData.N   = (sunindextype)atol(argv[1]);
  problem_size = ProbData.N;
  if (ProbData.N <= 0)
  {
    printf("ERROR: Problem size must be a positive integer\n");
    return 1;
  }
  maxl = atoi(argv[2]);
  if (maxl <= 0)
  {
    printf(
      "ERROR: Maximum Krylov subspace dimension must be a positive integer\n");
    return 1;
  }
  tol = atof(argv[3]);
  if (tol <= ZERO)
  {
    printf("ERROR: Solver tolerance must be a positive real number\n");
    return 1;
  }
  print_timing = atoi(argv[4]);
  SetTiming(print_timing);

  printf("\nPCG linear solver test:\n");
  printf("  Problem size = %ld\n", (long int)ProbData.N);
  printf("  Maximum Krylov subspace dimension = %i\n", maxl);
  printf("  Solver Tolerance = %g\n", tol);
  printf("  timing output flag = %i\n\n", print_timing);

  /* Create vectors */
  x = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(x, "N_VNew_Serial", 0)) { return 1; }
  xhat = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(xhat, "N_VNew_Serial", 0)) { return 1; }
  b = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(b, "N_VNew_Serial", 0)) { return 1; }
  ProbData.d = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.d, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s, "N_VNew_Serial", 0)) { return 1; }

  /* Fill xhat vector with uniform random data in [1,2] */
  vecdata = N_VGetArrayPointer(xhat);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + urand(); }

  /* Fill Jacobi vector with matrix diagonal */
  N_VConst(FIVE, ProbData.d);

  /* Create PCG linear solver */
  LS = SUNLinSol_PCG(x, SUN_PREC_RIGHT, maxl, sunctx);
  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_ITERATIVE, 0);
  fails += Test_SUNLinSolGetID(LS, SUNLINEARSOLVER_PCG, 0);
  fails += Test_SUNLinSolSetATimes(LS, &ProbData, ATimes, 0);
  fails += Test_SUNLinSolSetPreconditioner(LS, &ProbData, PSetup, PSolve, 0);
  fails += Test_SUNLinSolSetScalingVectors(LS, ProbData.s, NULL, 0);
  fails += Test_SUNLinSolSetZeroGuess(LS, 0);
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module failed %i initialization tests\n\n",
           fails);
    return 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module passed all initialization tests\n\n");
  }

  /*** Test 1: simple Poisson-like solve (no preconditioning) ***/

  /* set scaling vector */
  N_VConst(ONE, ProbData.s);

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run test with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 1, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 1, passed all tests\n\n");
  }

  /*** Test 2: simple Poisson-like solve (Jacobi preconditioning) ***/

  /* set scaling vector */
  N_VConst(ONE, ProbData.s);

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 2, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 2, passed all tests\n\n");
  }

  /*** Test 3: Poisson-like solve w/ scaling (no preconditioning) ***/

  /* set scaling vector */
  vecdata = N_VGetArrayPointer(ProbData.s);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 3, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 3, passed all tests\n\n");
  }

  /*** Test 4: Poisson-like solve w/ scaling (Jacobi preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VProd(xhat, ProbData.s, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_PCGSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_PCG module, problem 4, failed %i tests\n\n", fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_PCG module, problem 4, passed all tests\n\n");
  }

  /* Free solver and vectors */
  SUNLinSolFree(LS);
  N_VDestroy(x);
  N_VDestroy(xhat);
  N_VDestroy(b);
  N_VDestroy(ProbData.d);
  N_VDestroy(ProbData.s);
  SUNContext_Free(&sunctx);

  return (passfail);
}